

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O2

FxExpression * ParseExpressionH(FScanner *sc,PClassActor *cls)

{
  bool bVar1;
  FxExpression *l;
  FxExpression *r;
  FxExpression *this;
  
  l = ParseExpressionG(sc,cls);
  while( true ) {
    bVar1 = FScanner::CheckToken(sc,0x26);
    if (!bVar1) break;
    r = ParseExpressionG(sc,cls);
    this = (FxExpression *)operator_new(0x48);
    FxBinaryInt::FxBinaryInt((FxBinaryInt *)this,0x26,l,r);
    l = this;
  }
  return l;
}

Assistant:

static FxExpression *ParseExpressionH (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionG (sc, cls);

	while (sc.CheckToken('&'))
	{
		FxExpression *right = ParseExpressionG (sc, cls);
		tmp = new FxBinaryInt('&', tmp, right);
	}
	return tmp;
}